

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trainer.cc
# Opt level: O2

void __thiscall xLearn::Trainer::show_head_info(Trainer *this,bool validate)

{
  ostream *poVar1;
  Modifier green;
  Modifier reset;
  vector<int,_std::allocator<int>_> width_list;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  str_list;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  _Vector_base<int,_std::allocator<int>_> local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_98,"Epoch",(allocator *)&local_78);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_38,
             &local_98);
  std::__cxx11::string::~string((string *)&local_98);
  local_98._M_dataplus._M_p._0_4_ = 6;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            ((vector<int,_std::allocator<int>_> *)&local_58,(int *)&local_98);
  (*this->loss_->_vptr_Loss[8])(&local_78);
  std::operator+(&local_98,"Train ",&local_78);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_38,
             &local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  local_98._M_dataplus._M_p._0_4_ = 0x14;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            ((vector<int,_std::allocator<int>_> *)&local_58,(int *)&local_98);
  if (validate) {
    (*this->loss_->_vptr_Loss[8])(&local_78);
    std::operator+(&local_98,"Test ",&local_78);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_38,
               &local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
    local_98._M_dataplus._M_p._0_4_ = 0x14;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              ((vector<int,_std::allocator<int>_> *)&local_58,(int *)&local_98);
    if (this->metric_ != (Metric *)0x0) {
      (*this->metric_->_vptr_Metric[5])(&local_78);
      std::operator+(&local_98,"Test ",&local_78);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_38,
                 &local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_78);
      local_98._M_dataplus._M_p._0_4_ = 0x14;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                ((vector<int,_std::allocator<int>_> *)&local_58,(int *)&local_98);
    }
  }
  std::__cxx11::string::string((string *)&local_98,"Time cost (sec)",(allocator *)&local_78);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_38,
             &local_98);
  std::__cxx11::string::~string((string *)&local_98);
  local_98._M_dataplus._M_p._0_4_ = 0x14;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            ((vector<int,_std::allocator<int>_> *)&local_58,(int *)&local_98);
  local_78._M_dataplus._M_p._0_4_ = 0;
  local_98._M_dataplus._M_p._0_4_ = 0x20;
  poVar1 = Color::operator<<((ostream *)&std::cout,(Modifier *)&local_98);
  poVar1 = std::operator<<(poVar1,"[------------]");
  Color::operator<<(poVar1,(Modifier *)&local_78);
  Color::print_row<std::__cxx11::string>(&local_38,(vector<int,_std::allocator<int>_> *)&local_58);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38);
  return;
}

Assistant:

void Trainer::show_head_info(bool validate) {
  std::vector<std::string> str_list;
  std::vector<int> width_list;
  str_list.push_back("Epoch");
  width_list.push_back(6);
  str_list.push_back("Train " + loss_->loss_type());
  width_list.push_back(20);
  if (validate) {
    str_list.push_back("Test " + loss_->loss_type());
    width_list.push_back(20);
    if (metric_ != nullptr) {
      str_list.push_back("Test " + metric_->metric_type());
      width_list.push_back(20);
    }
  }
  str_list.push_back("Time cost (sec)");
  width_list.push_back(20);
  Color::Modifier green(Color::FG_GREEN);
  Color::Modifier reset(Color::RESET);
  std::cout << green << "[------------]" << reset;
  Color::print_row(str_list, width_list);
}